

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O2

RWNode * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createStore(LLVMReadWriteGraphBuilder *this,Instruction *Inst)

{
  Type *Ty;
  type tVar1;
  RWNode *pRVar2;
  Use *pUVar3;
  DataLayout *DL;
  Offset size;
  vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  *__range2;
  iterator __end2;
  GenericDefSite<dg::dda::RWNode> *ds;
  pointer __v;
  long lVar4;
  vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  defSites;
  
  pRVar2 = ReadWriteGraph::create(&this->graph,STORE);
  pUVar3 = llvm::User::getOperandList((User *)Inst);
  Ty = (Type *)**(undefined8 **)pUVar3;
  DL = GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::getDataLayout
                 (&this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>
                 );
  size.offset = llvmutils::getAllocatedSize(Ty,DL);
  tVar1 = Offset::UNKNOWN;
  if (size.offset == 0) {
    size.offset = Offset::UNKNOWN;
  }
  pUVar3 = llvm::User::getOperandList((User *)Inst);
  mapPointers(&defSites,this,(Value *)Inst,*(Value **)(pUVar3 + 0x20),size);
  lVar4 = 0xa0;
  if (((((long)defSites.
               super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)defSites.
               super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start == 0x18) &&
       (((defSites.
          super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->target->type | DYN_ALLOC) == GLOBAL)) &&
      (((defSites.
         super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->offset).offset != tVar1)) &&
     (lVar4 = 0xd0,
     ((defSites.
       super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->len).offset == tVar1)) {
    lVar4 = 0xa0;
  }
  for (__v = defSites.
             super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      __v != defSites.
             super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; __v = __v + 1) {
    std::
    _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
    ::_M_insert_unique<dg::dda::GenericDefSite<dg::dda::RWNode>const&>
              ((_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
                *)((long)&pRVar2->_vptr_RWNode + lVar4),__v);
  }
  std::
  _Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  ::~_Vector_base(&defSites.
                   super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                 );
  return pRVar2;
}

Assistant:

RWNode *LLVMReadWriteGraphBuilder::createStore(const llvm::Instruction *Inst) {
    RWNode &node = create(RWNodeType::STORE);

    uint64_t size = llvmutils::getAllocatedSize(Inst->getOperand(0)->getType(),
                                                getDataLayout());
    if (size == 0)
        size = Offset::UNKNOWN;

    auto defSites = mapPointers(Inst, Inst->getOperand(1), size);

    // strong update is possible only with must aliases that point
    // to the last instance of the memory object. Since detecting that
    // is not that easy, do strong updates only on must aliases
    // of local and global variables (and, of course, we must know the offsets)
    // FIXME: ALLOCAs in recursive procedures can also yield only weak update
    bool strong_update = false;
    if (defSites.size() == 1) {
        const auto &ds = *(defSites.begin());
        strong_update = (ds.target->isAlloc() || ds.target->isGlobal()) &&
                        !ds.offset.isUnknown() && !ds.len.isUnknown();
    }

    for (const auto &ds : defSites) {
        node.addDef(ds, strong_update);
    }

    return &node;
}